

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

YV12_BUFFER_CONFIG * av1_get_scaled_ref_frame(AV1_COMP *cpi,int ref_frame)

{
  RefCntBuffer *pRVar1;
  RefCntBuffer *pRVar2;
  int in_ESI;
  long in_RDI;
  RefCntBuffer *ref_buf;
  RefCntBuffer *scaled_buf;
  undefined8 in_stack_ffffffffffffffd8;
  YV12_BUFFER_CONFIG *pYVar3;
  AV1_COMMON *in_stack_ffffffffffffffe0;
  
  pRVar1 = *(RefCntBuffer **)(in_RDI + 0x42d38 + (long)(in_ESI + -1) * 8);
  pRVar2 = get_ref_frame_buf(in_stack_ffffffffffffffe0,
                             (MV_REFERENCE_FRAME)((ulong)in_stack_ffffffffffffffd8 >> 0x38));
  if ((pRVar1 == pRVar2) || (pRVar1 == (RefCntBuffer *)0x0)) {
    pYVar3 = (YV12_BUFFER_CONFIG *)0x0;
  }
  else {
    pYVar3 = &pRVar1->buf;
  }
  return pYVar3;
}

Assistant:

YV12_BUFFER_CONFIG *av1_get_scaled_ref_frame(const AV1_COMP *cpi,
                                             int ref_frame) {
  assert(ref_frame >= LAST_FRAME && ref_frame <= ALTREF_FRAME);
  RefCntBuffer *const scaled_buf = cpi->scaled_ref_buf[ref_frame - 1];
  const RefCntBuffer *const ref_buf =
      get_ref_frame_buf(&cpi->common, ref_frame);
  return (scaled_buf != ref_buf && scaled_buf != NULL) ? &scaled_buf->buf
                                                       : NULL;
}